

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O0

void __thiscall Sampling_SmoothStep_Test::~Sampling_SmoothStep_Test(Sampling_SmoothStep_Test *this)

{
  void *in_RDI;
  
  ~Sampling_SmoothStep_Test((Sampling_SmoothStep_Test *)0x654c58);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(Sampling, SmoothStep) {
    Float start = SampleSmoothStep(0, 10, 20);
    // Fairly high slop since lots of values close to the start are close
    // to zero.
    EXPECT_LT(std::abs(start - 10), .1) << start;

    Float end = SampleSmoothStep(1, -10, -5);
    EXPECT_LT(std::abs(end - -5), 1e-5) << end;

    Float mid = SampleSmoothStep(0.5, 0, 1);
    // Solved this numericalla in Mathematica.
    EXPECT_LT(std::abs(mid - 0.733615), 1e-5) << mid;

    for (Float u : Uniform1D(1000)) {
        Float x = SampleSmoothStep(u, -3, 5);
        Float ratio = SmoothStep(x, -3, 5) / SmoothStepPDF(x, -3, 5);
        // SmoothStep over [-3,5] integrates to 4.
        EXPECT_LT(std::abs(ratio - 4), 1e-5) << ratio;

        auto checkErr = [](Float a, Float b) {
            Float err;
            if (std::min(std::abs(a), std::abs(b)) < 1e-2)
                err = std::abs(a - b);
            else
                err = std::abs(2 * (a - b) / (a + b));
            return err > 1e-2;
        };
        EXPECT_FALSE(checkErr(u, InvertSmoothStepSample(x, -3, 5)));
    }

    auto ss = [](Float v) { return SmoothStep(v, 0, 1); };
    auto values = Sample1DFunction(ss, 1024, 64 * 1024, 0.f, 1.f);
    PiecewiseConstant1D distrib(values);
    for (Float u : Uniform1D(100, 62351)) {
        Float cx = SampleSmoothStep(u, 0, 1);
        Float cp = SmoothStepPDF(cx, 0, 1);

        Float dp;
        Float dx = distrib.Sample(u, &dp);
        EXPECT_LT(std::abs(cx - dx), 3e-3)
            << "Closed form = " << cx << ", distrib = " << dx;
        EXPECT_LT(std::abs(cp - dp), 3e-3)
            << "Closed form PDF = " << cp << ", distrib PDF = " << dp;
    }
}